

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consumer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 *in_RSI;
  int in_EDI;
  int MAX_RAW_MEM_BUFFER_SIZE;
  int MAX_RBUFFER_CAPACITY;
  int consumer_id;
  int in_stack_00000cb4;
  size_t in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  
  uVar4 = 0;
  if (in_EDI != 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar3 = std::operator<<(poVar3,(char *)*in_RSI);
    poVar3 = std::operator<<(poVar3," consumer_index");
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&std::cout,"ex: ");
    poVar3 = std::operator<<(poVar3,(char *)*in_RSI);
    poVar3 = std::operator<<(poVar3," 0");
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&std::cout,"ex: ");
    poVar3 = std::operator<<(poVar3,(char *)*in_RSI);
    poVar3 = std::operator<<(poVar3," 1");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  iVar2 = atoi((char *)in_RSI[1]);
  LOOP_CNT = 10000;
  bVar1 = SharedMemRingBuffer::Init
                    ((SharedMemRingBuffer *)CONCAT44(uVar4,in_EDI),(key_t)((ulong)in_RSI >> 0x20),
                     CONCAT44(iVar2,0x2000),1000000,in_stack_ffffffffffffffd8);
  if (bVar1) {
    TestFunc(in_stack_00000cb4);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"error");
    std::operator<<(poVar3,'\n');
  }
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc != 2) {
        std::cout << "usage: "<< argv[0]<<" consumer_index"  << '\n';
        std::cout << "ex: "<< argv[0]<<" 0"  << '\n';
        std::cout << "ex: "<< argv[0]<<" 1"  << '\n';
        exit(1);
    }

    int consumer_id = atoi(argv[1]);
    LOOP_CNT = 10000;    //should be same as producer for TEST
    int MAX_RBUFFER_CAPACITY = 1024*8; //should be same as producer for TEST
    int MAX_RAW_MEM_BUFFER_SIZE = 1000000; //should be same as producer for TEST

    if(! gSharedMemRingBuffer.Init(123456,
                                   MAX_RBUFFER_CAPACITY, 
                                   923456,
                                   MAX_RAW_MEM_BUFFER_SIZE ) )
    { 
        std::cerr << "error" << '\n';
        return 1; 
    }

    TestFunc(consumer_id);

    return 0;
}